

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O2

int sm2_sig_asn1_decode(uint8_t *r,uint8_t *s,uint8_t *sig,int siglen)

{
  int iVar1;
  int iVar2;
  int r_asn1_len;
  int s_asn1_len;
  int local_20;
  int local_1c;
  
  iVar1 = 0;
  iVar2 = 0;
  if ((((s != (uint8_t *)0x0) && (iVar2 = iVar1, r != (uint8_t *)0x0)) && (sig != (uint8_t *)0x0))
     && (((*sig == '0' && (sig[1] < 0x47)) && (sig[1] + 2 == siglen)))) {
    iVar1 = sm2_bn_asn1_decode(r,&local_20,sig + 2);
    if (iVar1 != 0) {
      iVar2 = sm2_bn_asn1_decode(s,&local_1c,sig + 2 + local_20);
    }
  }
  return iVar2;
}

Assistant:

int sm2_sig_asn1_decode(uint8_t r[32], uint8_t s[32], uint8_t sig[128], int siglen)
{
    int ret = GML_ERROR;
    int r_asn1_len, s_asn1_len;
    int total_len;

    if (sig == NULL || r == NULL || s == NULL)
        goto end;

    if (*sig != 0x30U) // sig = 0x30 ?? 02 ?? r 02 ?? s
        goto end;
    sig++;

    total_len = (int)(*sig); // sig = ?? 02 ?? r 02 ?? s
    if (total_len > 0x46 || siglen != (total_len + 2))
        goto end;
    sig++;

    if (sm2_bn_asn1_decode(r, &r_asn1_len, sig) == GML_ERROR)
        goto end;
    sig += r_asn1_len;

    if (sm2_bn_asn1_decode(s, &s_asn1_len, sig) == GML_ERROR)
        goto end;

    ret = GML_OK;
end:
    return ret;
}